

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s2;
  long lVar1;
  int iVar2;
  long lVar3;
  
  if (argc < 2) {
    help_main(argc,argv);
  }
  else {
    __s2 = argv[1];
    lVar1 = 0;
    while (lVar3 = lVar1, lVar3 + 0x18 != 0xd8) {
      iVar2 = strcmp(*(char **)((long)&commands[0].name + lVar3),__s2);
      lVar1 = lVar3 + 0x18;
      if (iVar2 == 0) {
        iVar2 = (**(code **)((long)&commands[0].main + lVar3))(argc,argv);
        return iVar2;
      }
    }
    fprintf(_stderr,"ERROR: Command \'%s\' not found. Try \'%s help\' for a list of commands.\n",
            argv[1],*argv);
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[]) {
    if(argc < 2) {
        help_main(argc, argv);
        return EXIT_FAILURE;
    }
    for(int i = 0; commands[i].name != nullptr; ++i) {
        if(strcmp(commands[i].name, argv[1]) == 0) {
            return commands[i].main(argc, argv);
        }
    }
    fprintf(stderr,
            "ERROR: Command '%s' not found. Try '%s help' for a list of "
            "commands.\n",
            argv[1], argv[0]);
    return EXIT_FAILURE;
}